

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstackedlayout.cpp
# Opt level: O2

bool __thiscall QStackedLayout::hasHeightForWidth(QStackedLayout *this)

{
  char cVar1;
  int iVar2;
  long *plVar3;
  int iVar4;
  int iVar5;
  
  iVar2 = (**(code **)(*(long *)&this->super_QLayout + 200))();
  iVar4 = 0;
  iVar5 = 0;
  if (0 < iVar2) {
    iVar4 = 0;
    iVar5 = iVar2;
  }
  for (; iVar5 != iVar4; iVar4 = iVar4 + 1) {
    plVar3 = (long *)(**(code **)(*(long *)&this->super_QLayout + 0xa8))(this,iVar4);
    if (plVar3 != (long *)0x0) {
      cVar1 = (**(code **)(*plVar3 + 0x48))(plVar3);
      if (cVar1 != '\0') break;
    }
  }
  return iVar4 < iVar2;
}

Assistant:

bool QStackedLayout::hasHeightForWidth() const
{
    const int n = count();

    for (int i = 0; i < n; ++i) {
        if (QLayoutItem *item = itemAt(i)) {
            if (item->hasHeightForWidth())
                return true;
        }
    }
    return false;
}